

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O1

void __thiscall
ON_RandomNumberGenerator::RandomPermutation
          (ON_RandomNumberGenerator *this,void *base,size_t nel,size_t sizeof_element)

{
  undefined1 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ON__UINT32 OVar4;
  undefined1 *puVar5;
  undefined8 *puVar6;
  undefined4 *puVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  void *pvVar12;
  ON__UINT32 *a;
  
  if ((((sizeof_element != 0) && (base != (void *)0x0)) && (1 < nel)) &&
     ((sizeof_element | nel) >> 0x20 == 0)) {
    iVar11 = (int)nel;
    if ((sizeof_element & 7) == 0) {
      uVar10 = 0;
      pvVar12 = base;
      do {
        OVar4 = on_random_number(&this->m_rand_context);
        uVar9 = (ulong)OVar4 % (ulong)(uint)(iVar11 - (int)uVar10);
        if ((int)uVar9 != 0) {
          puVar6 = (undefined8 *)((long)base + uVar9 * 8 + uVar10 * 8);
          uVar9 = 0;
          do {
            uVar3 = *(undefined8 *)((long)pvVar12 + uVar9 * 8);
            *(undefined8 *)((long)pvVar12 + uVar9 * 8) = *puVar6;
            *puVar6 = uVar3;
            puVar6 = puVar6 + 1;
            uVar9 = uVar9 + 1;
          } while (sizeof_element >> 3 != uVar9);
        }
        uVar10 = uVar10 + 1;
        pvVar12 = (void *)((long)pvVar12 + 8);
      } while (uVar10 != iVar11 + (uint)(iVar11 == 0));
    }
    else if ((sizeof_element & 3) == 0) {
      uVar10 = 0;
      pvVar12 = base;
      do {
        OVar4 = on_random_number(&this->m_rand_context);
        uVar9 = (ulong)OVar4 % (ulong)(uint)(iVar11 - (int)uVar10);
        if ((int)uVar9 != 0) {
          puVar7 = (undefined4 *)((long)base + uVar9 * 4 + uVar10 * 4);
          uVar9 = 0;
          do {
            uVar2 = *(undefined4 *)((long)pvVar12 + uVar9 * 4);
            *(undefined4 *)((long)pvVar12 + uVar9 * 4) = *puVar7;
            *puVar7 = uVar2;
            puVar7 = puVar7 + 1;
            uVar9 = uVar9 + 1;
          } while (sizeof_element >> 2 != uVar9);
        }
        uVar10 = uVar10 + 1;
        pvVar12 = (void *)((long)pvVar12 + 4);
      } while (uVar10 != iVar11 + (uint)(iVar11 == 0));
    }
    else {
      uVar10 = 0;
      pvVar12 = base;
      do {
        OVar4 = on_random_number(&this->m_rand_context);
        uVar9 = (ulong)OVar4 % (ulong)(uint)(iVar11 - (int)uVar10);
        if ((int)uVar9 != 0 && sizeof_element != 0) {
          puVar5 = (undefined1 *)((long)base + uVar9 + uVar10);
          sVar8 = 0;
          do {
            uVar1 = *(undefined1 *)((long)pvVar12 + sVar8);
            *(undefined1 *)((long)pvVar12 + sVar8) = *puVar5;
            *puVar5 = uVar1;
            puVar5 = puVar5 + 1;
            sVar8 = sVar8 + 1;
          } while (sizeof_element != sVar8);
        }
        uVar10 = uVar10 + 1;
        pvVar12 = (void *)((long)pvVar12 + 1);
      } while (uVar10 != iVar11 + (uint)(iVar11 == 0));
    }
  }
  return;
}

Assistant:

void ON_RandomNumberGenerator::RandomPermutation(void* base, size_t nel, size_t sizeof_element )
{
  ON__UINT32 i, j, n;

  if ( 0 == base || nel <= 1 || sizeof_element <= 0 )
    return;

#if ON_SIZEOF_POINTER > 4
  if ( nel > 0xFFFFFFFF || sizeof_element > 0xFFFFFFFF)
    return;
#endif

  n = (ON__UINT32)nel; // for 64 bit systems, nel is wider than n.

  // References: 
  //  http://en.wikipedia.org/wiki/Random_permutation
  //  http://en.wikipedia.org/wiki/Knuth_shuffle

  // Note:
  //   There is the usual "sloppy bias" in the code below because 
  //   (on_random_number(&m_rand_context) % N) is used to get a random
  //   number int the range 0 to N-1 when N is not a factor of 2^32.
  //   As usual, this bias is not worth worrying about
  //   unlsess 2^32 / N is smallish.  If you need a random
  //   permutation of a very large array, look elsewhere.

  if ( 0 == sizeof_element % sizeof(ON__UINT64) )
  {
    ON__UINT64* a = (ON__UINT64*)base;
    sizeof_element /= sizeof(a[0]);
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap8(sizeof_element, a+i, a+i+j);
      }
    }
  }
  else if ( 0 == sizeof_element % sizeof(ON__UINT32) )
  {
    ON__UINT32* a = (ON__UINT32*)base;
    sizeof_element /= sizeof(a[0]);
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap4(sizeof_element, a+i, a+i+j);
      }
    }
  }
  else
  {
    unsigned char* a = (unsigned char*)base;
    for ( i = 0; i < n; i++ )
    {
      j = on_random_number(&m_rand_context) % (n-i);
      if ( j )
      {
        Swap1(sizeof_element, a+i, a+i+j);
      }
    }
  }
}